

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_select::test_method(addrman_select *this)

{
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  CService ipIn_03;
  CService ipIn_04;
  CService ipIn_05;
  CService ipIn_06;
  CService ipIn_07;
  CService ipIn_08;
  CService ipIn_09;
  __single_object _Var1;
  bool bVar2;
  readonly_property65 rVar3;
  uint16_t uVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  undefined ***pppuVar8;
  int iVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_00;
  const_string file_11;
  const_string file_12;
  initializer_list<CAddress> __l_01;
  const_string file_13;
  initializer_list<CAddress> __l_02;
  const_string file_14;
  initializer_list<CAddress> __l_03;
  const_string file_15;
  const_string file_16;
  initializer_list<CAddress> __l_04;
  const_string file_17;
  const_string file_18;
  initializer_list<CAddress> __l_05;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  undefined4 uVar10;
  undefined4 uVar11;
  check_type cVar13;
  assertion_result *ar;
  assertion_result *ar_00;
  lazy_ostream *assertion_descr;
  undefined8 in_stack_fffffffffffff768;
  char *pcVar12;
  undefined8 in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  vector<CAddress,_std::allocator<CAddress>_> local_7e0;
  char **local_7c8;
  allocator<char> local_7ba;
  allocator_type local_7b9;
  vector<CAddress,_std::allocator<CAddress>_> local_7b8;
  assertion_result local_7a0;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  __single_object addrman;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> ports;
  CService local_3a0;
  CService local_378;
  CService local_350;
  CService local_328;
  CService local_300;
  CService local_2d8;
  CService addr7;
  CService addr6;
  CService addr5;
  CService local_238;
  CService local_210;
  CService addr4;
  CService addr3;
  CService local_198;
  CService addr2;
  CService local_148;
  CService local_120;
  CService addr1;
  CNetAddr source;
  direct_or_indirect local_b0;
  __node_base local_a0;
  CService *pCStack_98;
  _Prime_rehash_policy local_90;
  __node_base_ptr p_Stack_80;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_4_ = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x8c;
  file.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3f8,msg);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = CNetAddr::IsValid((CNetAddr *)local_78);
  addr1.super_CNetAddr.m_addr._union.direct[0] = !bVar2;
  addr1.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1.super_CNetAddr.m_addr._size = 0;
  addr1.super_CNetAddr.m_addr._20_4_ = 0;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select(false).first.IsValid()";
  addr2.super_CNetAddr.m_addr._union._8_8_ = (long)"!addrman->Select(false).first.IsValid()" + 0x27;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_400 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1,(lazy_ostream *)&ports,1,0,WARN,_cVar13,(size_t)&local_408,
             0x8c);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = (iterator)0x8d;
  file_00.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_428,
             msg_00);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = CNetAddr::IsValid((CNetAddr *)local_78);
  addr1.super_CNetAddr.m_addr._union.direct[0] = !bVar2;
  addr1.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1.super_CNetAddr.m_addr._size = 0;
  addr1.super_CNetAddr.m_addr._20_4_ = 0;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select(true).first.IsValid()";
  addr2.super_CNetAddr.m_addr._union._8_8_ = (long)"!addrman->Select(true).first.IsValid()" + 0x26;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_430 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1,(lazy_ostream *)&ports,1,0,WARN,_cVar13,(size_t)&local_438,
             0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"252.2.2.2",(allocator<char> *)&local_b0);
  ResolveIP(&source,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.1.1.1",(allocator<char> *)&local_b0);
  ResolveService(&addr1,(string *)local_78,0x208d);
  std::__cxx11::string::~string((string *)local_78);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x93;
  file_01.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_458,
             msg_01);
  _Var1 = addrman;
  CService::CService(&local_120,&addr1);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar13;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff768;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn,(ServiceFlags)&local_120);
  __l._M_len = 1;
  __l._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2,__l,(allocator_type *)&addr4);
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr2,&source,(seconds)0x0);
  ar = (assertion_result *)&ports;
  ports._M_t._M_impl._0_1_ = bVar2;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  addr3.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  addr3.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_460 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = &addr3;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)&local_b0,1,0,WARN,_cVar13,(size_t)&local_468,0x93);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x94;
  file_02.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_488,
             msg_02);
  local_78[8] = '\0';
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_490 = "";
  local_b0.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pppuVar8 = (undefined ***)&local_b0;
  ports._M_t._M_impl._0_4_ = 1;
  pcVar12 = "1U";
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_498,0x94,1,2,pppuVar8,0xb4ecd9);
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pppuVar8;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x96;
  file_03.m_begin = (iterator)&local_4a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4b8,
             msg_03);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)local_78,&addr1);
  addr2.super_CNetAddr.m_addr._union.direct[0] = bVar2;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  addr3.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( true).first == addr1";
  addr3.super_CNetAddr.m_addr._union._8_8_ = (long)"addrman->Select( true).first == addr1" + 0x25;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4c0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&ports,1,0,WARN,(check_type)ar,
             (size_t)&local_4c8,0x96);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x97;
  file_04.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4e8,
             msg_04);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)local_78,&addr1);
  addr2.super_CNetAddr.m_addr._union.direct[0] = bVar2;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  addr3.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( false).first == addr1";
  addr3.super_CNetAddr.m_addr._union._8_8_ = (long)"addrman->Select( false).first == addr1" + 0x26;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f0 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&ports,1,0,WARN,(check_type)ar,
             (size_t)&local_4f8,0x97);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  file_05.m_end = (iterator)0x9a;
  file_05.m_begin = (iterator)&local_508;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_518,
             msg_05);
  _Var1 = addrman;
  CService::CService(&local_148,&addr1);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = ar;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_00,(ServiceFlags)&local_148);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  bVar2 = AddrMan::Good((AddrMan *)
                        _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_78,
                        (NodeSeconds)tVar5.__d.__r);
  ar_00 = (assertion_result *)&ports;
  ports._M_t._M_impl._0_1_ = bVar2;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Good(CAddress(addr1, NODE_NONE))";
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Good(CAddress(addr1, NODE_NONE))" + 0x2a;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_520 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = &addr2;
  boost::test_tools::tt_detail::report_assertion
            (ar_00,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)ar,(size_t)&local_528,0x9a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_148);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  file_06.m_end = (iterator)0x9c;
  file_06.m_begin = (iterator)&local_538;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_548,
             msg_06);
  local_78[8] = '\0';
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_550 = "";
  local_b0.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pppuVar8 = (undefined ***)&local_b0;
  ports._M_t._M_impl._0_4_ = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_558,0x9c,1,2,pppuVar8,0xb4ecd9,ar_00,"1U");
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pppuVar8;
  msg_07.m_begin = pvVar6;
  file_07.m_end = (iterator)0x9d;
  file_07.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_578,
             msg_07);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = CNetAddr::IsValid((CNetAddr *)local_78);
  addr2.super_CNetAddr.m_addr._union.direct[0] = !bVar2;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  addr3.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( true).first.IsValid()";
  addr3.super_CNetAddr.m_addr._union._8_8_ = (long)"!addrman->Select( true).first.IsValid()" + 0x27;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_580 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&ports,1,0,WARN,(check_type)ar_00,
             (size_t)&local_588,0x9d);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  file_08.m_end = (iterator)0x9e;
  file_08.m_begin = (iterator)&local_598;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5a8,
             msg_08);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)local_78,&addr1);
  addr2.super_CNetAddr.m_addr._union.direct[0] = bVar2;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  addr3.super_CNetAddr.m_addr._union.indirect_contents.indirect = "addrman->Select().first == addr1"
  ;
  addr3.super_CNetAddr.m_addr._union._8_8_ = (long)"addrman->Select().first == addr1" + 0x20;
  assertion_descr = (lazy_ostream *)&ports;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,assertion_descr,1,0,WARN,(check_type)ar_00,
             (size_t)&local_5b8,0x9e);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  file_09.m_end = (iterator)0x9f;
  file_09.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5d8,
             msg_09);
  local_78[8] = '\0';
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e0 = "";
  local_b0.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pppuVar8 = (undefined ***)&local_b0;
  ports._M_t._M_impl._0_4_ = 1;
  pcVar12 = "1U";
  uVar10 = 0xb4ecd9;
  uVar11 = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_5e8,0x9f,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.3.1.1",(allocator<char> *)&local_b0);
  ResolveService(&addr2,(string *)local_78,0x208d);
  std::__cxx11::string::~string((string *)local_78);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pppuVar8;
  msg_10.m_begin = pvVar6;
  file_10.m_end = (iterator)0xa3;
  file_10.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_608,
             msg_10);
  _Var1 = addrman;
  CService::CService(&local_198,&addr2);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_01,(ServiceFlags)&local_198);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr3,__l_00,(allocator_type *)&addr5);
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr3,&addr2.super_CNetAddr,
                       (seconds)0x0);
  ports._M_t._M_impl._0_1_ = bVar2;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  addr4.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Add({CAddress(addr2, NODE_NONE)}, addr2)";
  addr4.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Add({CAddress(addr2, NODE_NONE)}, addr2)" + 0x31;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_610 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = &addr4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_618,0xa3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr3);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_198);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  file_11.m_end = (iterator)0xa4;
  file_11.m_begin = (iterator)&local_628;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_638,
             msg_11);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pCStack_98 = (CService *)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)local_78,&addr2);
  addr3.super_CNetAddr.m_addr._union.direct[0] = bVar2;
  addr3.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr3.super_CNetAddr.m_addr._size = 0;
  addr3.super_CNetAddr.m_addr._20_4_ = 0;
  addr4.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( true).first == addr2";
  addr4.super_CNetAddr.m_addr._union._8_8_ = (long)"addrman->Select( true).first == addr2" + 0x25;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  ports._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_640 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&addr4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr3,(lazy_ostream *)&ports,1,0,WARN,(check_type)assertion_descr,
             (size_t)&local_648,0xa4);
  boost::detail::shared_count::~shared_count((shared_count *)&addr3.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.3.2.2",(allocator<char> *)&local_b0);
  ResolveService(&addr3,(string *)local_78,9999);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.3.3.3",(allocator<char> *)&local_b0);
  ResolveService(&addr4,(string *)local_78,9999);
  std::__cxx11::string::~string((string *)local_78);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar6;
  file_12.m_end = (iterator)0xaa;
  file_12.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_668,
             msg_12);
  _Var1 = addrman;
  CService::CService(&local_210,&addr3);
  ipIn_02.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_02.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_02.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_02.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_02.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_02.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_02._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_02,(ServiceFlags)&local_210);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr5,__l_01,(allocator_type *)&addr7);
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr5,&addr2.super_CNetAddr,
                       (seconds)0x0);
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pCStack_98 = &addr6;
  addr6.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Add({CAddress(addr3, NODE_NONE)}, addr2)";
  addr6.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Add({CAddress(addr3, NODE_NONE)}, addr2)" + 0x31;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_670 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ports._M_t._M_impl._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_678,0xaa);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr5);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_210);
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  file_13.m_end = (iterator)0xab;
  file_13.m_begin = (iterator)&local_688;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_698,
             msg_13);
  _Var1 = addrman;
  CService::CService(&local_238,&addr4);
  ipIn_03.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_03.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_03.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_03.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_03.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_03.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_03._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_03,(ServiceFlags)&local_238);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr7,__l_02,
             (allocator_type *)&local_7a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ports,"250.4.1.1",(allocator<char> *)&local_7b8);
  ResolveService((CService *)&local_b0,(string *)&ports,0x208d);
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr7,(CNetAddr *)&local_b0,
                       (seconds)0x0);
  addr6.super_CNetAddr.m_addr._union.direct[0] = bVar2;
  addr6.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr6.super_CNetAddr.m_addr._size = 0;
  addr6.super_CNetAddr.m_addr._20_4_ = 0;
  addr5.super_CNetAddr._24_8_ = &local_7e0;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4f0be;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4f10b;
  addr5.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr5.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr5.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6a0 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr6,(lazy_ostream *)&addr5,1,0,WARN,(check_type)assertion_descr,
             (size_t)&local_6a8,0xab);
  boost::detail::shared_count::~shared_count((shared_count *)&addr6.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b0);
  std::__cxx11::string::~string((string *)&ports);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr7);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.4.4.4",(allocator<char> *)&local_b0);
  ResolveService(&addr5,(string *)local_78,0x208d);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.4.5.5",(allocator<char> *)&local_b0);
  ResolveService(&addr6,(string *)local_78,0x1e61);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"250.4.6.6",(allocator<char> *)&local_b0);
  ResolveService(&addr7,(string *)local_78,0x208d);
  std::__cxx11::string::~string((string *)local_78);
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  file_14.m_end = (iterator)0xb2;
  file_14.m_begin = (iterator)&local_6b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6c8,
             msg_14);
  _Var1 = addrman;
  CService::CService(&local_2d8,&addr5);
  ipIn_04.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_04.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_04.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_04.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_04.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_04.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_04._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_04,(ServiceFlags)&local_2d8);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_7e0,__l_03,(allocator_type *)&local_7b8);
  ports._M_t._M_impl._0_1_ =
       AddrMan::Add((AddrMan *)
                    _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_7e0,
                    &addr3.super_CNetAddr,(seconds)0x0);
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7a0._0_8_ = "addrman->Add({CAddress(addr5, NODE_NONE)}, addr3)";
  local_7a0.m_message.px = (element_type *)0xb4f15b;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6d0 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = (CService *)&local_7a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_6d8,0xb2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_7e0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2d8);
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  file_15.m_end = (iterator)0xb3;
  file_15.m_begin = (iterator)&local_6e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_6f8,
             msg_15);
  _Var1 = addrman;
  CService::CService(&local_300,&addr5);
  ipIn_05.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_05.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_05.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_05.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_05.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_05.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_05._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_05,(ServiceFlags)&local_300);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  ports._M_t._M_impl._0_1_ =
       AddrMan::Good((AddrMan *)
                     _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                     super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_78,
                     (NodeSeconds)tVar5.__d.__r);
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4f15c;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4f185;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_700 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = (CService *)&local_7e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_708,0xb3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300);
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  file_16.m_end = (iterator)0xb4;
  file_16.m_begin = (iterator)&local_718;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_728,
             msg_16);
  _Var1 = addrman;
  CService::CService(&local_328,&addr6);
  ipIn_06.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_06.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_06.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_06.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_06.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_06.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_06._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_06,(ServiceFlags)&local_328);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_7e0,__l_04,(allocator_type *)&local_7b8);
  ports._M_t._M_impl._0_1_ =
       AddrMan::Add((AddrMan *)
                    _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_7e0,
                    &addr3.super_CNetAddr,(seconds)0x0);
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7a0._0_8_ = "addrman->Add({CAddress(addr6, NODE_NONE)}, addr3)";
  local_7a0.m_message.px = (element_type *)0xb4f1b7;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_730 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = (CService *)&local_7a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_738,0xb4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_7e0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_328);
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  file_17.m_end = (iterator)0xb5;
  file_17.m_begin = (iterator)&local_748;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_758,
             msg_17);
  _Var1 = addrman;
  CService::CService(&local_350,&addr6);
  ipIn_07.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_07.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_07.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_07.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_07.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_07.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_07._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_07,(ServiceFlags)&local_350);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  ports._M_t._M_impl._0_1_ =
       AddrMan::Good((AddrMan *)
                     _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                     super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_78,
                     (NodeSeconds)tVar5.__d.__r);
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4f1b8;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4f1e1;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_760 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = (CService *)&local_7e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_768,0xb5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_350);
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  file_18.m_end = (iterator)0xb6;
  file_18.m_begin = (iterator)&local_778;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_788,
             msg_18);
  _Var1 = addrman;
  CService::CService(&local_378,&addr7);
  ipIn_08.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_08.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_08.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_08.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_08.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_08.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_08._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_08,(ServiceFlags)&local_378);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_7b8,__l_05,&local_7b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ports,"250.1.1.3",&local_7ba);
  ResolveService((CService *)&local_b0,(string *)&ports,0x208d);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_7b8,
                    (CNetAddr *)&local_b0,(seconds)0x0);
  local_7a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_7a0.m_message.px = (element_type *)0x0;
  local_7a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7c8 = &local_7f0;
  local_7f0 = "addrman->Add({CAddress(addr7, NODE_NONE)}, ResolveService(\"250.1.1.3\", 8333))";
  local_7e8 = "";
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7f8 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_7a0,(lazy_ostream *)&local_7e0,1,0,WARN,(check_type)assertion_descr,
             (size_t)&local_800,0xb6);
  boost::detail::shared_count::~shared_count(&local_7a0.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b0);
  std::__cxx11::string::~string((string *)&ports);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_7b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_378);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  file_19.m_end = (iterator)0xb7;
  file_19.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_820,
             msg_19);
  _Var1 = addrman;
  CService::CService(&local_3a0,&addr7);
  ipIn_09.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_09.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_09.super_CNetAddr.m_addr._union._8_8_ = assertion_descr;
  ipIn_09.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_09.super_CNetAddr.m_net = (int)in_stack_fffffffffffff770;
  ipIn_09.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  ipIn_09._32_8_ = in_stack_fffffffffffff778;
  CAddress::CAddress((CAddress *)local_78,ipIn_09,(ServiceFlags)&local_3a0);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  ports._M_t._M_impl._0_1_ =
       AddrMan::Good((AddrMan *)
                     _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                     super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_78,
                     (NodeSeconds)tVar5.__d.__r);
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4f230;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4f259;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_828 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  pCStack_98 = (CService *)&local_7e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ports,(lazy_ostream *)&local_b0,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_830,0xb7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a0);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  file_20.m_end = (iterator)0xba;
  file_20.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_850,
             msg_20);
  local_78[8] = '\0';
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_858 = "";
  local_b0.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pppuVar8 = (undefined ***)&local_b0;
  ports._M_t._M_impl._0_4_ = 7;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&local_860,0xba,1,2,pppuVar8,0xb4ecd9,(assertion_result *)&ports,"7U");
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ports._M_t._M_impl.super__Rb_tree_header._M_header;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar9 = 0x14;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (bVar2 = iVar9 != 0, iVar9 = iVar9 + -1, bVar2) {
    local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
    local_b0._8_8_ = 1;
    local_a0._M_nxt = (_Hash_node_base *)0x0;
    pCStack_98 = (CService *)0x0;
    local_90._M_max_load_factor = 1.0;
    local_90._4_4_ = 0;
    local_90._M_next_resize = 0;
    p_Stack_80 = (__node_base_ptr)0x0;
    AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)local_78,
                    (AddrMan *)
                    addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&local_b0);
    uVar4 = CService::GetPort((CService *)local_78);
    local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT62(local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                           .super__Vector_impl_data._M_start._2_6_,uVar4);
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>(&ports._M_t,(unsigned_short *)&local_7e0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
    std::
    _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&local_b0);
  }
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)pppuVar8;
  msg_21.m_begin = pvVar6;
  file_21.m_end = (iterator)0xc1;
  file_21.m_begin = (iterator)&local_870;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_880,
             msg_21);
  local_78[8] = '\0';
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b0.indirect_contents.indirect =
       (char *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_7e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,3);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_78,&stack0xfffffffffffff770,0xc1,1,2,&local_b0,0xb4f25a,&local_7e0,"3U");
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&ports._M_t);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr7);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr6);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr5);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr4);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(false).first.IsValid());
    BOOST_CHECK(!addrman->Select(true).first.IsValid());

    CNetAddr source = ResolveIP("252.2.2.2");

    // Add 1 address to the new table
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // Move address to the tried table
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));

    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    BOOST_CHECK(!addrman->Select(/*new_only=*/true).first.IsValid());
    BOOST_CHECK(addrman->Select().first == addr1);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Add one address to the new table
    CService addr2 = ResolveService("250.3.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr2);

    // Add two more addresses to the new table
    CService addr3 = ResolveService("250.3.2.2", 9999);
    CService addr4 = ResolveService("250.3.3.3", 9999);

    BOOST_CHECK(addrman->Add({CAddress(addr3, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Add({CAddress(addr4, NODE_NONE)}, ResolveService("250.4.1.1", 8333)));

    // Add three addresses to tried table.
    CService addr5 = ResolveService("250.4.4.4", 8333);
    CService addr6 = ResolveService("250.4.5.5", 7777);
    CService addr7 = ResolveService("250.4.6.6", 8333);

    BOOST_CHECK(addrman->Add({CAddress(addr5, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr5, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr6, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr6, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr7, NODE_NONE)}, ResolveService("250.1.1.3", 8333)));
    BOOST_CHECK(addrman->Good(CAddress(addr7, NODE_NONE)));

    // 6 addrs + 1 addr from last test = 7.
    BOOST_CHECK_EQUAL(addrman->Size(), 7U);

    // Select pulls from new and tried regardless of port number.
    std::set<uint16_t> ports;
    for (int i = 0; i < 20; ++i) {
        ports.insert(addrman->Select().first.GetPort());
    }
    BOOST_CHECK_EQUAL(ports.size(), 3U);
}